

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_debug.cpp
# Opt level: O1

FString __thiscall FGLDebug::TypeToString(FGLDebug *this,GLenum type)

{
  char *copyStr;
  
  this->mCurrentLevel = 0x87e02c;
  this->mBreakpointMode = false;
  *(undefined3 *)&this->field_0x5 = 0;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  if ((int)type < 0x8268) {
    switch(type) {
    case 0x824c:
      copyStr = "error";
      break;
    case 0x824d:
      copyStr = "deprecated";
      break;
    case 0x824e:
      copyStr = "undefined";
      break;
    case 0x824f:
      copyStr = "portability";
      break;
    case 0x8250:
      copyStr = "performance";
      break;
    case 0x8251:
      copyStr = "other";
      break;
    default:
switchD_0045ca0b_default:
      FString::Format((FString *)this,"%d");
      return (FString)(char *)this;
    }
  }
  else if (type == 0x8268) {
    copyStr = "marker";
  }
  else if (type == 0x8269) {
    copyStr = "push group";
  }
  else {
    if (type != 0x826a) goto switchD_0045ca0b_default;
    copyStr = "pop group";
  }
  FString::operator=((FString *)this,copyStr);
  return (FString)(char *)this;
}

Assistant:

FString FGLDebug::TypeToString(GLenum type)
{
	FString s;
	switch (type)
	{
	case GL_DEBUG_TYPE_ERROR: s = "error"; break;
	case GL_DEBUG_TYPE_DEPRECATED_BEHAVIOR: s = "deprecated"; break;
	case GL_DEBUG_TYPE_UNDEFINED_BEHAVIOR: s = "undefined"; break;
	case GL_DEBUG_TYPE_PORTABILITY: s = "portability"; break;
	case GL_DEBUG_TYPE_PERFORMANCE: s = "performance"; break;
	case GL_DEBUG_TYPE_MARKER: s = "marker"; break;
	case GL_DEBUG_TYPE_PUSH_GROUP: s = "push group"; break;
	case GL_DEBUG_TYPE_POP_GROUP: s = "pop group"; break;
	case GL_DEBUG_TYPE_OTHER: s = "other"; break;
	default: s.Format("%d", (int)type);
	}
	return s;
}